

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructions.c
# Opt level: O3

int parse_arguments(pExecutor exec,pUserFunction func,Expr *args,int argc)

{
  int iVar1;
  Expr *__ptr;
  Expr *pEVar2;
  Expr *pEVar3;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  Expr EVar10;
  int rest_pos;
  int opt_pos;
  int local_50;
  uint local_4c;
  ulong local_48;
  pUserFunction local_40;
  long local_38;
  anon_union_8_8_707b72ea_for_Expr_1 aVar4;
  
  iVar1 = scan_arguments(exec,args,argc,(int *)&local_4c,&local_50);
  if (iVar1 != 0) {
    lVar5 = (long)(int)local_4c;
    local_38 = (long)local_50;
    uVar8 = ~local_4c + local_50;
    uVar6 = 0;
    if (0 < (int)uVar8) {
      uVar6 = uVar8;
    }
    local_40 = func;
    __ptr = (Expr *)malloc(lVar5 * 0x10);
    if (__ptr == (Expr *)0x0) {
      puts("parse_arguments: malloc failed");
      return 0;
    }
    local_48 = (ulong)local_4c;
    pEVar2 = (Expr *)malloc((ulong)uVar6 << 4);
    if (pEVar2 == (Expr *)0x0) {
      puts("parse_arguments: malloc failed");
    }
    else {
      pEVar3 = (Expr *)malloc((ulong)uVar6 << 4);
      if (pEVar3 != (Expr *)0x0) {
        if (0 < (int)local_48) {
          memcpy(__ptr,args,local_48 << 4);
        }
        if (0 < (int)uVar8) {
          lVar7 = 0;
          do {
            EVar10._4_4_ = 0;
            EVar10.type = *(uint *)((long)&args[lVar5 + 1].type + lVar7);
            EVar10.field_1.val_atom =
                 ((anon_union_8_8_707b72ea_for_Expr_1 *)((long)&args[lVar5 + 1].field_1 + lVar7))->
                 val_atom;
            parse_opt_arg(exec,EVar10,(Expr *)((long)&pEVar2->type + lVar7),
                          (Expr *)((long)&pEVar3->type + lVar7));
            lVar7 = lVar7 + 0x10;
          } while ((ulong)uVar8 << 4 != lVar7);
        }
        if ((int)local_38 == argc) {
          EVar10 = make_none();
          aVar4 = EVar10.field_1;
          uVar9 = (ulong)EVar10.type;
        }
        else {
          uVar9 = *(ulong *)(args + local_38 + 1);
          aVar4 = args[local_38 + 1].field_1;
        }
        local_40->args = __ptr;
        local_40->argc = (int)local_48;
        local_40->opt = pEVar2;
        local_40->def = pEVar3;
        local_40->optc = uVar6;
        *(ulong *)&local_40->rest = uVar9;
        (local_40->rest).field_1.val_atom = (size_t)aVar4;
        return 1;
      }
      puts("parse_arguments: malloc failed");
      free(__ptr);
      __ptr = pEVar2;
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

int parse_arguments(pExecutor exec, pUserFunction func, Expr *args, int argc)
{
    int opt_pos, rest_pos;
    if (!scan_arguments(exec, args, argc, &opt_pos, &rest_pos))
        return 0;

    int req_len = opt_pos;
    int opt_len = rest_pos - opt_pos - 1;
    if (opt_len < 0) opt_len = 0;
    int rest_len = argc - rest_pos;

    Expr *req, *opt, *def, rest;

    req = malloc(req_len * sizeof(Expr));
    if (req == NULL)
    {
        log("parse_arguments: malloc failed");
        return 0;
    }
    opt = malloc(opt_len * sizeof(Expr));
    if (opt == NULL)
    {
        log("parse_arguments: malloc failed");
        free(req);
        return 0;
    }
    def = malloc(opt_len * sizeof(Expr));
    if (def == NULL)
    {
        log("parse_arguments: malloc failed");
        free(req);
        free(opt);
        return 0;
    }

    for (int i = 0; i < req_len; i++)
        req[i] = args[i];
    for (int i = 0; i < opt_len; i++)
        parse_opt_arg(exec, args[opt_pos + 1 + i], opt + i, def + i);
    if (rest_len != 0)
        rest = args[rest_pos + 1];
    else
        rest = make_none();

    func->args = req;
    func->argc = req_len;
    func->opt = opt;
    func->def = def;
    func->optc = opt_len;
    func->rest = rest;

    return 1;
}